

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CjkBreakEngine::divideUpDictionaryRange
          (CjkBreakEngine *this,UText *inText,int32_t rangeStart,int32_t rangeEnd,
          UVector32 *foundBreaks)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  LocalPointer<icu_63::UVector32> LVar4;
  UBool UVar5;
  UChar32 UVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int32_t offset;
  int iVar11;
  int32_t iVar12;
  int64_t iVar13;
  UVector32 *pUVar14;
  undefined4 extraout_var;
  LocalPointerBase<icu_63::UVector32> this_00;
  ushort uVar15;
  ulong uVar16;
  bool bVar17;
  int32_t i;
  int iVar18;
  uint uVar19;
  int iVar20;
  size_t sVar21;
  UnicodeString *size;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  UErrorCode status;
  LocalPointer<icu_63::UVector32> inputMap;
  UnicodeString inString;
  long local_1d8;
  UVector32 bestSnlp;
  ConstChar16Ptr local_190;
  UVector32 lengths;
  UVector32 t_boundary;
  UVector32 values;
  UVector32 prev;
  UText fu;
  
  if (rangeEnd - rangeStart == 0 || rangeEnd < rangeStart) {
    return 0;
  }
  inString.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr =
       (LocalPointerBase<icu_63::UVector32>)(UVector32 *)0x0;
  inString.fUnion.fStackFields.fLengthAndFlags = 2;
  status = U_ZERO_ERROR;
  lVar26 = (long)rangeEnd;
  sVar21 = (size_t)rangeStart;
  if (((((inText->providerProperties & 4) == 0) ||
       (lVar1 = inText->chunkNativeStart, (long)sVar21 < lVar1)) ||
      (inText->chunkNativeLimit < lVar26)) || ((long)inText->nativeIndexingLimit < lVar26 - lVar1))
  {
    utext_setNativeIndex_63(inText,sVar21);
    iVar13 = utext_nativeLength_63(inText);
    if (iVar13 < lVar26) {
      iVar13 = utext_nativeLength_63(inText);
      rangeEnd = (int32_t)iVar13;
    }
    pUVar14 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,sVar21);
    if (pUVar14 != (UVector32 *)0x0) {
      UVector32::UVector32(pUVar14,&status);
    }
    LocalPointer<icu_63::UVector32>::adoptInsteadAndCheckErrorCode(&inputMap,pUVar14,&status);
    if (U_ZERO_ERROR < status) goto LAB_002f4d1f;
    while (iVar13 = utext_getNativeIndex_63(inText), iVar13 < rangeEnd) {
      iVar13 = utext_getNativeIndex_63(inText);
      UVar6 = utext_next32_63(inText);
      UnicodeString::append(&inString,UVar6);
      while( true ) {
        uVar7 = inString.fUnion.fFields.fLength;
        if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
          uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if ((int)uVar7 <= *(int *)((long)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr + 8)
           ) break;
        UVector32::addElement
                  ((UVector32 *)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr,
                   (int32_t)iVar13,&status);
      }
    }
    UVector32::addElement
              ((UVector32 *)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr,rangeEnd,&status)
    ;
  }
  else {
    local_190.p_ = inText->chunkContents + (sVar21 - lVar1);
    UnicodeString::setTo(&inString,'\0',&local_190,rangeEnd - rangeStart);
  }
  size = &inString;
  iVar8 = (*(this->nfkcNorm2->super_UObject)._vptr_UObject[0xb])(this->nfkcNorm2,size,&status);
  if ((char)iVar8 == '\0') {
    fu._0_8_ = &PTR__UnicodeString_003e4bf0;
    fu.providerProperties._0_2_ = 2;
    this_00.ptr = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
    if (this_00.ptr != (UVector32 *)0x0) {
      UVector32::UVector32(this_00.ptr,&status);
    }
    if (status < U_ILLEGAL_ARGUMENT_ERROR && this_00.ptr == (UVector32 *)0x0) {
      status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        bestSnlp.super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003e4bf0;
        bestSnlp.count = CONCAT22(bestSnlp.count._2_2_,2);
        prev.super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003e4bf0;
        prev.count = CONCAT22(prev.count._2_2_,2);
        uVar9 = 0;
        while( true ) {
          uVar7 = inString.fUnion.fFields.fLength;
          if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
            uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if ((int)uVar7 <= (int)uVar9) break;
          uVar15 = (ushort)bestSnlp.count & 0x1e;
          if ((bestSnlp.count & 1U) != 0) {
            uVar15 = 2;
          }
          bestSnlp.count = CONCAT22(bestSnlp.count._2_2_,uVar15);
          uVar19 = UnicodeString::char32At(&inString,uVar9);
          uVar10 = uVar9;
          do {
            UnicodeString::append((UnicodeString *)&bestSnlp,uVar19);
            uVar10 = UnicodeString::moveIndex32(&inString,uVar10,1);
            uVar7 = inString.fUnion.fFields.fLength;
            if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
              uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            if (uVar10 == uVar7) break;
            uVar19 = UnicodeString::char32At(&inString,uVar10);
            iVar8 = (*(this->nfkcNorm2->super_UObject)._vptr_UObject[0xf])
                              (this->nfkcNorm2,(ulong)uVar19);
          } while ((char)iVar8 == '\0');
          (*(this->nfkcNorm2->super_UObject)._vptr_UObject[3])
                    (this->nfkcNorm2,&bestSnlp,&prev,&status);
          UnicodeString::append((UnicodeString *)&fu,(UnicodeString *)&prev);
          if (inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr == (UVector32 *)0x0) {
            iVar12 = uVar9 + rangeStart;
          }
          else {
            iVar12 = 0;
            if ((-1 < (int)uVar9) &&
               ((int)uVar9 <
                *(int *)((long)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr + 8))) {
              iVar12 = *(int32_t *)
                        (*(long *)((long)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr +
                                  0x18) + (ulong)uVar9 * 4);
            }
          }
          do {
            iVar8 = fu.sizeOfStruct;
            if (-1 < (short)fu.providerProperties) {
              iVar8 = (int)(short)fu.providerProperties >> 5;
            }
            uVar9 = uVar10;
          } while (((this_00.ptr)->count < iVar8) &&
                  (UVector32::addElement(this_00.ptr,iVar12,&status),
                  status < U_ILLEGAL_ARGUMENT_ERROR));
        }
        if (inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr == (UVector32 *)0x0) {
          iVar12 = uVar7 + rangeStart;
        }
        else {
          iVar12 = 0;
          if ((-1 < (int)uVar7) &&
             ((int)uVar7 <
              *(int *)((long)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr + 8))) {
            iVar12 = *(int32_t *)
                      (*(long *)((long)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr + 0x18
                                ) + (ulong)(uint)uVar7 * 4);
          }
        }
        UVector32::addElement(this_00.ptr,iVar12,&status);
        if (inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr != (UVector32 *)0x0) {
          (**(code **)(*(long *)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr + 8))();
        }
        inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr =
             (LocalPointerBase<icu_63::UVector32>)(LocalPointerBase<icu_63::UVector32>)this_00.ptr;
        UnicodeString::moveFrom(&inString,(UnicodeString *)&fu);
        UnicodeString::~UnicodeString((UnicodeString *)&prev);
        UnicodeString::~UnicodeString((UnicodeString *)&bestSnlp);
        UnicodeString::~UnicodeString((UnicodeString *)&fu);
        goto LAB_002f4dba;
      }
      if (this_00.ptr != (UVector32 *)0x0) {
        (*((this_00.ptr)->super_UObject)._vptr_UObject[1])(this_00.ptr);
      }
    }
    UnicodeString::~UnicodeString((UnicodeString *)&fu);
LAB_002f4d1f:
    uVar10 = 0;
LAB_002f558a:
    if (inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr != (UVector32 *)0x0) {
      (**(code **)(*(long *)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr + 8))();
    }
    UnicodeString::~UnicodeString(&inString);
    return uVar10;
  }
LAB_002f4dba:
  sVar21 = 0;
  uVar9 = UnicodeString::countChar32(&inString,0,0x7fffffff);
  LVar4 = inputMap;
  uVar24 = CONCAT44(extraout_var,uVar9);
  uVar7 = inString.fUnion.fFields.fLength;
  if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
    uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if (uVar9 != uVar7) {
    if (inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr == (UVector32 *)0x0) {
      pUVar14 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,sVar21);
      if (pUVar14 != (UVector32 *)0x0) {
        UVector32::UVector32(pUVar14,&status);
      }
      LocalPointer<icu_63::UVector32>::adoptInsteadAndCheckErrorCode(&inputMap,pUVar14,&status);
      if (U_ZERO_ERROR < status) goto LAB_002f4d1f;
    }
    iVar8 = 0;
    uVar16 = 0;
    while( true ) {
      iVar18 = (int)uVar16;
      if (LVar4.super_LocalPointerBase<icu_63::UVector32>.ptr == (UVector32 *)0x0) {
        UVector32::addElement
                  ((UVector32 *)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr,
                   iVar18 + rangeStart,&status);
      }
      else {
        iVar12 = 0;
        if ((-1 < iVar18) &&
           (iVar12 = 0,
           iVar18 < *(int *)((long)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr + 8))) {
          iVar12 = *(int32_t *)
                    (*(long *)((long)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr + 0x18)
                    + uVar16 * 4);
        }
        UVector32::setElementAt
                  ((UVector32 *)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr,iVar12,iVar8)
        ;
      }
      uVar7 = inString.fUnion.fFields.fLength;
      if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
        uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (iVar18 == uVar7) break;
      iVar8 = iVar8 + 1;
      uVar10 = UnicodeString::moveIndex32(&inString,iVar18,1);
      uVar16 = (ulong)uVar10;
    }
  }
  iVar8 = uVar9 + 1;
  UVector32::UVector32(&bestSnlp,iVar8,&status);
  uVar16 = 0;
  UVector32::addElement(&bestSnlp,0,&status);
  if (0 < (int)uVar9) {
    uVar16 = (ulong)uVar9;
  }
  uVar22 = uVar16;
  while (iVar18 = (int)uVar22, uVar22 = (ulong)(iVar18 - 1), iVar18 != 0) {
    UVector32::addElement(&bestSnlp,-1,&status);
  }
  UVector32::UVector32(&prev,iVar8,&status);
  for (iVar18 = 0; iVar18 <= (int)uVar9; iVar18 = iVar18 + 1) {
    UVector32::addElement(&prev,-1,&status);
  }
  UVector32::UVector32(&values,uVar9,&status);
  UVector32::setSize(&values,uVar9);
  UVector32::UVector32(&lengths,uVar9,&status);
  UVector32::setSize(&lengths,uVar9);
  memset(&fu,0,0x90);
  fu.magic = 0x345ad82c;
  fu.sizeOfStruct = 0x90;
  utext_openUnicodeString_63(&fu,&inString,&status);
  local_1d8 = 0;
  iVar12 = 0;
  bVar2 = false;
  for (uVar22 = 0; uVar10 = 1, uVar22 != uVar16; uVar22 = uVar22 + 1) {
    if (((long)bestSnlp.count <= (long)uVar22) || (bestSnlp.elements[uVar22] != -1)) {
      utext_setNativeIndex_63(&fu,(long)iVar12);
      uVar10 = (*this->fDictionary->_vptr_DictionaryMatcher[2])
                         (this->fDictionary,&fu,0x14,uVar24,0,lengths.elements,values.elements,0);
      if ((uVar10 == 0) || ((lengths.count < 1 || (*lengths.elements != 1)))) {
        UVar6 = UnicodeString::char32At(&inString,iVar12);
        UVar5 = UnicodeSet::contains(&this->fHangulWordSet,UVar6);
        if (UVar5 == '\0') {
          UVector32::setElementAt(&values,0xff,uVar10);
          UVector32::setElementAt(&lengths,1,uVar10);
          uVar10 = uVar10 + 1;
        }
      }
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      for (uVar23 = 0; iVar18 = (int)uVar22, uVar10 != uVar23; uVar23 = uVar23 + 1) {
        iVar20 = 0;
        iVar11 = 0;
        if ((long)uVar22 < (long)bestSnlp.count) {
          iVar11 = bestSnlp.elements[uVar22];
        }
        if ((long)uVar23 < (long)values.count) {
          iVar20 = values.elements[uVar23];
        }
        iVar25 = 0;
        if ((long)uVar23 < (long)lengths.count) {
          iVar25 = lengths.elements[uVar23];
        }
        uVar19 = iVar25 + iVar18;
        if (((int)uVar19 < bestSnlp.count && -1 < (int)uVar19) &&
           ((uint)(iVar20 + iVar11) < (uint)bestSnlp.elements[uVar19])) {
          UVector32::setElementAt(&bestSnlp,iVar20 + iVar11,uVar19);
          UVector32::setElementAt(&prev,iVar18,uVar19);
        }
      }
      UVar6 = UnicodeString::char32At(&inString,iVar12);
      bVar17 = UVar6 != 0x30fb && UVar6 - 0x30a1U < 0x5e || UVar6 - 0xff66U < 0x3a;
      bVar3 = !bVar2;
      bVar2 = bVar17;
      if (bVar3 && bVar17 == true) {
        offset = UnicodeString::moveIndex32(&inString,iVar12,1);
        lVar26 = 1;
        while( true ) {
          uVar7 = inString.fUnion.fFields.fLength;
          if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
            uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          uVar10 = (uint)lVar26;
          if (((int)uVar7 <= offset) || (0x13 < uVar10)) break;
          UVar6 = UnicodeString::char32At(&inString,offset);
          if ((0x39 < UVar6 - 0xff66U) && (UVar6 == 0x30fb || 0x5d < UVar6 - 0x30a1U))
          goto LAB_002f521d;
          offset = UnicodeString::moveIndex32(&inString,offset,1);
          lVar26 = lVar26 + 1;
        }
        if (0x13 < uVar10) goto LAB_002f52a0;
LAB_002f521d:
        iVar11 = 0;
        if ((long)uVar22 < (long)bestSnlp.count) {
          iVar11 = bestSnlp.elements[uVar22];
        }
        iVar20 = 0x2000;
        if (uVar10 < 9) {
          iVar20 = *(int *)(getKatakanaCost(int)::katakanaCost + lVar26 * 4);
        }
        iVar25 = iVar18 + uVar10;
        if ((iVar25 < bestSnlp.count) &&
           ((uint)(iVar20 + iVar11) < *(uint *)((long)bestSnlp.elements + lVar26 * 4 + local_1d8)))
        {
          UVector32::setElementAt(&bestSnlp,iVar20 + iVar11,iVar25);
          UVector32::setElementAt(&prev,iVar18,iVar25);
        }
      }
    }
LAB_002f52a0:
    iVar12 = UnicodeString::moveIndex32(&inString,iVar12,1);
    local_1d8 = local_1d8 + 4;
  }
  utext_close_63(&fu);
  UVector32::UVector32(&t_boundary,iVar8,&status);
  iVar8 = -1;
  if ((((int)uVar9 < 0) || (bestSnlp.count <= (int)uVar9)) || (bestSnlp.elements[uVar9] != -1)) {
    uVar10 = 0;
    while (iVar12 = (int32_t)uVar24, 0 < iVar12) {
      UVector32::addElement(&t_boundary,iVar12,&status);
      uVar9 = 0;
      if (iVar12 < prev.count) {
        uVar9 = prev.elements[uVar24 & 0xffffffff];
      }
      uVar10 = uVar10 + 1;
      uVar24 = (ulong)uVar9;
    }
  }
  else {
    UVector32::addElement(&t_boundary,uVar9,&status);
  }
  uVar9 = foundBreaks->count;
  if ((ulong)uVar9 != 0) {
    if ((int)uVar9 < 1) {
      iVar18 = 0;
    }
    else {
      iVar18 = foundBreaks->elements[(ulong)uVar9 - 1];
    }
    if (rangeStart <= iVar18) goto LAB_002f54d0;
  }
  UVector32::addElement(&t_boundary,0,&status);
  uVar10 = uVar10 + 1;
LAB_002f54d0:
  uVar24 = (ulong)uVar10;
  do {
    uVar16 = uVar24 & 0xffffffff;
    iVar18 = iVar8;
    while( true ) {
      uVar24 = uVar24 - 1;
      iVar11 = (int)uVar16;
      if (iVar11 < 1) {
        UVector32::~UVector32(&t_boundary);
        UVector32::~UVector32(&lengths);
        UVector32::~UVector32(&values);
        UVector32::~UVector32(&prev);
        UVector32::~UVector32(&bestSnlp);
        goto LAB_002f558a;
      }
      uVar16 = 0;
      if (iVar11 <= t_boundary.count) {
        uVar16 = (ulong)(uint)t_boundary.elements[uVar24];
      }
      iVar20 = (int)uVar16;
      if (inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr == (UVector32 *)0x0) {
        iVar8 = iVar20 + rangeStart;
      }
      else {
        iVar8 = 0;
        if ((-1 < iVar20) &&
           (iVar20 < *(int *)((long)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr + 8))) {
          iVar8 = *(int *)(*(long *)((long)inputMap.super_LocalPointerBase<icu_63::UVector32>.ptr +
                                    0x18) + uVar16 * 4);
        }
      }
      if (iVar8 <= iVar18) break;
      uVar16 = (ulong)(iVar11 - 1);
      UVector32::addElement(foundBreaks,iVar8,&status);
      iVar18 = iVar8;
    }
    uVar10 = uVar10 - 1;
  } while( true );
}

Assistant:

int32_t 
CjkBreakEngine::divideUpDictionaryRange( UText *inText,
        int32_t rangeStart,
        int32_t rangeEnd,
        UVector32 &foundBreaks ) const {
    if (rangeStart >= rangeEnd) {
        return 0;
    }

    // UnicodeString version of input UText, NFKC normalized if necessary.
    UnicodeString inString;

    // inputMap[inStringIndex] = corresponding native index from UText inText.
    // If NULL then mapping is 1:1
    LocalPointer<UVector32>     inputMap;

    UErrorCode     status      = U_ZERO_ERROR;


    // if UText has the input string as one contiguous UTF-16 chunk
    if ((inText->providerProperties & utext_i32_flag(UTEXT_PROVIDER_STABLE_CHUNKS)) &&
         inText->chunkNativeStart <= rangeStart &&
         inText->chunkNativeLimit >= rangeEnd   &&
         inText->nativeIndexingLimit >= rangeEnd - inText->chunkNativeStart) {

        // Input UText is in one contiguous UTF-16 chunk.
        // Use Read-only aliasing UnicodeString.
        inString.setTo(FALSE,
                       inText->chunkContents + rangeStart - inText->chunkNativeStart,
                       rangeEnd - rangeStart);
    } else {
        // Copy the text from the original inText (UText) to inString (UnicodeString).
        // Create a map from UnicodeString indices -> UText offsets.
        utext_setNativeIndex(inText, rangeStart);
        int32_t limit = rangeEnd;
        U_ASSERT(limit <= utext_nativeLength(inText));
        if (limit > utext_nativeLength(inText)) {
            limit = (int32_t)utext_nativeLength(inText);
        }
        inputMap.adoptInsteadAndCheckErrorCode(new UVector32(status), status);
        if (U_FAILURE(status)) {
            return 0;
        }
        while (utext_getNativeIndex(inText) < limit) {
            int32_t nativePosition = (int32_t)utext_getNativeIndex(inText);
            UChar32 c = utext_next32(inText);
            U_ASSERT(c != U_SENTINEL);
            inString.append(c);
            while (inputMap->size() < inString.length()) {
                inputMap->addElement(nativePosition, status);
            }
        }
        inputMap->addElement(limit, status);
    }


    if (!nfkcNorm2->isNormalized(inString, status)) {
        UnicodeString normalizedInput;
        //  normalizedMap[normalizedInput position] ==  original UText position.
        LocalPointer<UVector32> normalizedMap(new UVector32(status), status);
        if (U_FAILURE(status)) {
            return 0;
        }
        
        UnicodeString fragment;
        UnicodeString normalizedFragment;
        for (int32_t srcI = 0; srcI < inString.length();) {  // Once per normalization chunk
            fragment.remove();
            int32_t fragmentStartI = srcI;
            UChar32 c = inString.char32At(srcI);
            for (;;) {
                fragment.append(c);
                srcI = inString.moveIndex32(srcI, 1);
                if (srcI == inString.length()) {
                    break;
                }
                c = inString.char32At(srcI);
                if (nfkcNorm2->hasBoundaryBefore(c)) {
                    break;
                }
            }
            nfkcNorm2->normalize(fragment, normalizedFragment, status);
            normalizedInput.append(normalizedFragment);

            // Map every position in the normalized chunk to the start of the chunk
            //   in the original input.
            int32_t fragmentOriginalStart = inputMap.isValid() ?
                    inputMap->elementAti(fragmentStartI) : fragmentStartI+rangeStart;
            while (normalizedMap->size() < normalizedInput.length()) {
                normalizedMap->addElement(fragmentOriginalStart, status);
                if (U_FAILURE(status)) {
                    break;
                }
            }
        }
        U_ASSERT(normalizedMap->size() == normalizedInput.length());
        int32_t nativeEnd = inputMap.isValid() ?
                inputMap->elementAti(inString.length()) : inString.length()+rangeStart;
        normalizedMap->addElement(nativeEnd, status);

        inputMap.moveFrom(normalizedMap);
        inString.moveFrom(normalizedInput);
    }

    int32_t numCodePts = inString.countChar32();
    if (numCodePts != inString.length()) {
        // There are supplementary characters in the input.
        // The dictionary will produce boundary positions in terms of code point indexes,
        //   not in terms of code unit string indexes.
        // Use the inputMap mechanism to take care of this in addition to indexing differences
        //    from normalization and/or UTF-8 input.
        UBool hadExistingMap = inputMap.isValid();
        if (!hadExistingMap) {
            inputMap.adoptInsteadAndCheckErrorCode(new UVector32(status), status);
            if (U_FAILURE(status)) {
                return 0;
            }
        }
        int32_t cpIdx = 0;
        for (int32_t cuIdx = 0; ; cuIdx = inString.moveIndex32(cuIdx, 1)) {
            U_ASSERT(cuIdx >= cpIdx);
            if (hadExistingMap) {
                inputMap->setElementAt(inputMap->elementAti(cuIdx), cpIdx);
            } else {
                inputMap->addElement(cuIdx+rangeStart, status);
            }
            cpIdx++;
            if (cuIdx == inString.length()) {
               break;
            }
        }
    }
                
    // bestSnlp[i] is the snlp of the best segmentation of the first i
    // code points in the range to be matched.
    UVector32 bestSnlp(numCodePts + 1, status);
    bestSnlp.addElement(0, status);
    for(int32_t i = 1; i <= numCodePts; i++) {
        bestSnlp.addElement(kuint32max, status);
    }


    // prev[i] is the index of the last CJK code point in the previous word in 
    // the best segmentation of the first i characters.
    UVector32 prev(numCodePts + 1, status);
    for(int32_t i = 0; i <= numCodePts; i++){
        prev.addElement(-1, status);
    }

    const int32_t maxWordSize = 20;
    UVector32 values(numCodePts, status);
    values.setSize(numCodePts);
    UVector32 lengths(numCodePts, status);
    lengths.setSize(numCodePts);

    UText fu = UTEXT_INITIALIZER;
    utext_openUnicodeString(&fu, &inString, &status);

    // Dynamic programming to find the best segmentation.

    // In outer loop, i  is the code point index,
    //                ix is the corresponding string (code unit) index.
    //    They differ when the string contains supplementary characters.
    int32_t ix = 0;
    bool is_prev_katakana = false;
    for (int32_t i = 0;  i < numCodePts;  ++i, ix = inString.moveIndex32(ix, 1)) {
        if ((uint32_t)bestSnlp.elementAti(i) == kuint32max) {
            continue;
        }

        int32_t count;
        utext_setNativeIndex(&fu, ix);
        count = fDictionary->matches(&fu, maxWordSize, numCodePts,
                             NULL, lengths.getBuffer(), values.getBuffer(), NULL);
                             // Note: lengths is filled with code point lengths
                             //       The NULL parameter is the ignored code unit lengths.

        // if there are no single character matches found in the dictionary 
        // starting with this character, treat character as a 1-character word 
        // with the highest value possible, i.e. the least likely to occur.
        // Exclude Korean characters from this treatment, as they should be left
        // together by default.
        if ((count == 0 || lengths.elementAti(0) != 1) &&
                !fHangulWordSet.contains(inString.char32At(ix))) {
            values.setElementAt(maxSnlp, count);   // 255
            lengths.setElementAt(1, count++);
        }

        for (int32_t j = 0; j < count; j++) {
            uint32_t newSnlp = (uint32_t)bestSnlp.elementAti(i) + (uint32_t)values.elementAti(j);
            int32_t ln_j_i = lengths.elementAti(j) + i;
            if (newSnlp < (uint32_t)bestSnlp.elementAti(ln_j_i)) {
                bestSnlp.setElementAt(newSnlp, ln_j_i);
                prev.setElementAt(i, ln_j_i);
            }
        }

        // In Japanese,
        // Katakana word in single character is pretty rare. So we apply
        // the following heuristic to Katakana: any continuous run of Katakana
        // characters is considered a candidate word with a default cost
        // specified in the katakanaCost table according to its length.

        bool is_katakana = isKatakana(inString.char32At(ix));
        int32_t katakanaRunLength = 1;
        if (!is_prev_katakana && is_katakana) {
            int32_t j = inString.moveIndex32(ix, 1);
            // Find the end of the continuous run of Katakana characters
            while (j < inString.length() && katakanaRunLength < kMaxKatakanaGroupLength &&
                    isKatakana(inString.char32At(j))) {
                j = inString.moveIndex32(j, 1);
                katakanaRunLength++;
            }
            if (katakanaRunLength < kMaxKatakanaGroupLength) {
                uint32_t newSnlp = bestSnlp.elementAti(i) + getKatakanaCost(katakanaRunLength);
                if (newSnlp < (uint32_t)bestSnlp.elementAti(i+katakanaRunLength)) {
                    bestSnlp.setElementAt(newSnlp, i+katakanaRunLength);
                    prev.setElementAt(i, i+katakanaRunLength);  // prev[j] = i;
                }
            }
        }
        is_prev_katakana = is_katakana;
    }
    utext_close(&fu);

    // Start pushing the optimal offset index into t_boundary (t for tentative).
    // prev[numCodePts] is guaranteed to be meaningful.
    // We'll first push in the reverse order, i.e.,
    // t_boundary[0] = numCodePts, and afterwards do a swap.
    UVector32 t_boundary(numCodePts+1, status);

    int32_t numBreaks = 0;
    // No segmentation found, set boundary to end of range
    if ((uint32_t)bestSnlp.elementAti(numCodePts) == kuint32max) {
        t_boundary.addElement(numCodePts, status);
        numBreaks++;
    } else {
        for (int32_t i = numCodePts; i > 0; i = prev.elementAti(i)) {
            t_boundary.addElement(i, status);
            numBreaks++;
        }
        U_ASSERT(prev.elementAti(t_boundary.elementAti(numBreaks - 1)) == 0);
    }

    // Add a break for the start of the dictionary range if there is not one
    // there already.
    if (foundBreaks.size() == 0 || foundBreaks.peeki() < rangeStart) {
        t_boundary.addElement(0, status);
        numBreaks++;
    }

    // Now that we're done, convert positions in t_boundary[] (indices in 
    // the normalized input string) back to indices in the original input UText
    // while reversing t_boundary and pushing values to foundBreaks.
    int32_t prevCPPos = -1;
    int32_t prevUTextPos = -1;
    for (int32_t i = numBreaks-1; i >= 0; i--) {
        int32_t cpPos = t_boundary.elementAti(i);
        U_ASSERT(cpPos > prevCPPos);
        int32_t utextPos =  inputMap.isValid() ? inputMap->elementAti(cpPos) : cpPos + rangeStart;
        U_ASSERT(utextPos >= prevUTextPos);
        if (utextPos > prevUTextPos) {
            // Boundaries are added to foundBreaks output in ascending order.
            U_ASSERT(foundBreaks.size() == 0 || foundBreaks.peeki() < utextPos);
            foundBreaks.push(utextPos, status);
        } else {
            // Normalization expanded the input text, the dictionary found a boundary
            // within the expansion, giving two boundaries with the same index in the
            // original text. Ignore the second. See ticket #12918.
            --numBreaks;
        }
        prevCPPos = cpPos;
        prevUTextPos = utextPos;
    }
    (void)prevCPPos; // suppress compiler warnings about unused variable

    // inString goes out of scope
    // inputMap goes out of scope
    return numBreaks;
}